

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

void __thiscall kratos::StatementGraph::add_stmt_child(StatementGraph *this,Stmt *stmt)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  mapped_type *pmVar5;
  undefined4 extraout_var_00;
  __node_base_ptr p_Var6;
  StmtException *pSVar7;
  __hash_code __code;
  ulong uVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  long lVar11;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  Stmt *local_b8;
  Stmt *local_b0;
  _Rb_tree<kratos::StmtNode*,kratos::StmtNode*,std::_Identity<kratos::StmtNode*>,std::less<kratos::StmtNode*>,std::allocator<kratos::StmtNode*>>
  *local_a8;
  undefined1 local_a0 [24];
  _Rb_tree_node_base _Stack_88;
  undefined8 uStack_68;
  mapped_type *local_60;
  mapped_type *node;
  Stmt *local_48;
  Stmt *s;
  Stmt *stmt_local;
  
  s = stmt;
  iVar3 = (*(stmt->super_IRNode)._vptr_IRNode[1])(stmt);
  uVar1 = (this->nodes_)._M_h._M_bucket_count;
  uVar8 = (ulong)s % uVar1;
  p_Var9 = (this->nodes_)._M_h._M_buckets[uVar8];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var9->_M_nxt, p_Var6 = p_Var9, s != (Stmt *)p_Var9->_M_nxt[1]._M_nxt)) {
    while (p_Var9 = p_Var2, p_Var2 = p_Var9->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar8) ||
         (p_Var6 = p_Var9, s == (Stmt *)p_Var2[1]._M_nxt)) goto LAB_001c12b0;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_001c12b0:
  if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
    pmVar5 = (mapped_type *)0x0;
  }
  else {
    pmVar5 = std::__detail::
             _Map_base<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this,&s);
  }
  if (CONCAT44(extraout_var,iVar3) != 0) {
    local_a8 = (_Rb_tree<kratos::StmtNode*,kratos::StmtNode*,std::_Identity<kratos::StmtNode*>,std::less<kratos::StmtNode*>,std::allocator<kratos::StmtNode*>>
                *)&pmVar5->children;
    lVar11 = 0;
    do {
      iVar4 = (*(s->super_IRNode)._vptr_IRNode[2])(s,lVar11);
      if (*(int *)(CONCAT44(extraout_var_00,iVar4) + 0x48) == 2) {
        local_48 = (Stmt *)__dynamic_cast(CONCAT44(extraout_var_00,iVar4),&IRNode::typeinfo,
                                          &Stmt::typeinfo,0);
        if (local_48 == (Stmt *)0x0) {
          pSVar7 = (StmtException *)__cxa_allocate_exception(0x10);
          local_a0._0_8_ = local_a0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a0,"Non statement in statement block","");
          local_b8 = s;
          __l._M_len = 1;
          __l._M_array = (iterator)&local_b8;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                     &stack0xffffffffffffffa0,__l,(allocator_type *)((long)&stmt_local + 7));
          StmtException::StmtException
                    (pSVar7,(string *)local_a0,
                     (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                     &stack0xffffffffffffffa0);
          __cxa_throw(pSVar7,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar1 = (this->nodes_)._M_h._M_bucket_count;
        uVar8 = (ulong)local_48 % uVar1;
        p_Var9 = (this->nodes_)._M_h._M_buckets[uVar8];
        p_Var6 = (__node_base_ptr)0x0;
        if ((p_Var9 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var9, p_Var10 = p_Var9->_M_nxt, local_48 != (Stmt *)p_Var9->_M_nxt[1]._M_nxt)
           ) {
          while (p_Var2 = p_Var10->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
            p_Var6 = (__node_base_ptr)0x0;
            if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar8) ||
               (p_Var6 = p_Var10, p_Var10 = p_Var2, local_48 == (Stmt *)p_Var2[1]._M_nxt))
            goto LAB_001c1380;
          }
          p_Var6 = (__node_base_ptr)0x0;
        }
LAB_001c1380:
        if ((p_Var6 != (__node_base_ptr)0x0) && (p_Var6->_M_nxt != (_Hash_node_base *)0x0)) {
          pSVar7 = (StmtException *)__cxa_allocate_exception(0x10);
          local_a0._0_8_ = local_a0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a0,"Duplicated statement detected","");
          local_b8 = s;
          local_b0 = local_48;
          __l_00._M_len = 2;
          __l_00._M_array = (iterator)&local_b8;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                     &stack0xffffffffffffffa0,__l_00,(allocator_type *)((long)&stmt_local + 7));
          StmtException::StmtException
                    (pSVar7,(string *)local_a0,
                     (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                     &stack0xffffffffffffffa0);
          __cxa_throw(pSVar7,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
        _Stack_88._M_parent = (_Base_ptr)0x0;
        local_a0._16_8_ = 0;
        _Stack_88._M_color = _S_red;
        _Stack_88._4_4_ = 0;
        _Stack_88._M_left = &_Stack_88;
        uStack_68 = 0;
        local_a0._0_8_ = pmVar5;
        local_a0._8_8_ = local_48;
        _Stack_88._M_right = _Stack_88._M_left;
        std::
        _Hashtable<kratos::Stmt*,std::pair<kratos::Stmt*const,kratos::StmtNode>,std::allocator<std::pair<kratos::Stmt*const,kratos::StmtNode>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<kratos::Stmt*&,kratos::StmtNode&>
                  ((_Hashtable<kratos::Stmt*,std::pair<kratos::Stmt*const,kratos::StmtNode>,std::allocator<std::pair<kratos::Stmt*const,kratos::StmtNode>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)this,&local_48,local_a0);
        local_60 = std::__detail::
                   _Map_base<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_48);
        if (pmVar5 != (mapped_type *)0x0) {
          std::
          _Rb_tree<kratos::StmtNode*,kratos::StmtNode*,std::_Identity<kratos::StmtNode*>,std::less<kratos::StmtNode*>,std::allocator<kratos::StmtNode*>>
          ::_M_emplace_unique<kratos::StmtNode*&>(local_a8,&stack0xffffffffffffffa0);
        }
        add_stmt_child(this,local_48);
        std::
        _Rb_tree<kratos::StmtNode_*,_kratos::StmtNode_*,_std::_Identity<kratos::StmtNode_*>,_std::less<kratos::StmtNode_*>,_std::allocator<kratos::StmtNode_*>_>
        ::~_Rb_tree((_Rb_tree<kratos::StmtNode_*,_kratos::StmtNode_*,_std::_Identity<kratos::StmtNode_*>,_std::less<kratos::StmtNode_*>,_std::allocator<kratos::StmtNode_*>_>
                     *)(local_a0 + 0x10));
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != CONCAT44(extraout_var,iVar3));
  }
  return;
}

Assistant:

void StatementGraph::add_stmt_child(Stmt *stmt) {
    auto child_count = stmt->child_count();
    StmtNode *parent_node;
    if (nodes_.find(stmt) == nodes_.end())
        parent_node = nullptr;
    else
        parent_node = &nodes_.at(stmt);
    for (uint64_t i = 0; i < child_count; i++) {
        auto *ir_node = stmt->get_child(i);
        if (ir_node->ir_node_kind() != IRNodeKind::StmtKind) continue;
        auto *s = dynamic_cast<Stmt *>(ir_node);
        if (!s) throw StmtException("Non statement in statement block", {stmt});
        if (nodes_.find(s) != nodes_.end())
            throw StmtException("Duplicated statement detected", {stmt, s});
        StmtNode node_value{parent_node, s, {}};
        nodes_.emplace(s, node_value);
        auto *node = &nodes_.at(s);
        if (parent_node) parent_node->children.emplace(node);
        add_stmt_child(s);
    }
}